

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateGeneric::ConstraintsBiLoad_C
          (ChLinkMateGeneric *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChConstraintTwoBodies *pCVar4;
  undefined1 auVar6 [16];
  char cVar7;
  int iVar8;
  long lVar9;
  pointer ppCVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar18 [64];
  ulong local_38;
  double dVar5;
  
  auVar18._8_56_ = in_register_00001248;
  auVar18._0_8_ = recovery_clamp;
  iVar8 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])();
  if ((char)iVar8 != '\0') {
    iVar8 = (this->mask).nconstr;
    if (0 < iVar8) {
      lVar12 = 0;
      iVar11 = 0;
      auVar13._8_8_ = 0x8000000000000000;
      auVar13._0_8_ = 0x8000000000000000;
      auVar13 = vxorpd_avx512vl(auVar18._0_16_,auVar13);
      do {
        lVar9 = (long)iVar8;
        if (lVar9 <= lVar12) goto LAB_005a5ed3;
        pCVar4 = (this->mask).constraints.
                 super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar12];
        if ((pCVar4->super_ChConstraintTwo).super_ChConstraint.active == true) {
          if (do_clamp) {
            cVar7 = (**(code **)((long)(pCVar4->super_ChConstraintTwo).super_ChConstraint.
                                       _vptr_ChConstraint + 0x18))();
            lVar9 = (long)(this->mask).nconstr;
            local_38 = auVar13._0_8_;
            if (cVar7 == '\0') {
              if (lVar9 <= lVar12) goto LAB_005a5ed3;
              if ((iVar11 < 0) ||
                 ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                  m_rows <= (long)iVar11)) goto LAB_005a5ef2;
              ppCVar10 = (this->mask).constraints.
                         super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_38;
              auVar16._8_8_ = 0;
              auVar16._0_8_ =
                   factor * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[iVar11];
              auVar6 = vmaxsd_avx(auVar16,auVar2);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = recovery_clamp;
              auVar6 = vminsd_avx(auVar6,auVar3);
              dVar5 = auVar6._0_8_;
            }
            else {
              if (lVar9 <= lVar12) {
LAB_005a5ed3:
                __assert_fail("(i >= 0) && (i < nconstr)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                              ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
              }
              if ((iVar11 < 0) ||
                 ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                  m_rows <= (long)iVar11)) goto LAB_005a5ef2;
              ppCVar10 = (this->mask).constraints.
                         super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = local_38;
              auVar14._8_8_ = 0;
              auVar14._0_8_ =
                   factor * (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
                            m_storage.m_data.array[iVar11];
              auVar6 = vmaxsd_avx(auVar14,auVar1);
              dVar5 = auVar6._0_8_;
            }
            (ppCVar10[lVar12]->super_ChConstraintTwo).super_ChConstraint.b_i =
                 dVar5 + (ppCVar10[lVar12]->super_ChConstraintTwo).super_ChConstraint.b_i;
          }
          else {
            if ((iVar11 < 0) ||
               ((this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                m_rows <= (long)iVar11)) {
LAB_005a5ef2:
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                           );
            }
            auVar15._8_8_ = 0;
            auVar15._0_8_ =
                 (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.
                 m_data.array[iVar11];
            auVar17._8_8_ = 0;
            auVar17._0_8_ = factor;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = (pCVar4->super_ChConstraintTwo).super_ChConstraint.b_i;
            auVar6 = vfmadd213sd_fma(auVar15,auVar17,auVar6);
            (pCVar4->super_ChConstraintTwo).super_ChConstraint.b_i = auVar6._0_8_;
          }
          iVar8 = (this->mask).nconstr;
          iVar11 = iVar11 + 1;
          lVar9 = (long)iVar8;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < lVar9);
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!this->IsActive())
        return;

    //***TEST***
    /*
        GetLog()<< "cload: " ;
        if (this->c_x) GetLog()<< " x";
        if (this->c_y) GetLog()<< " y";
        if (this->c_z) GetLog()<< " z";
        if (this->c_rx) GetLog()<< " Rx";
        if (this->c_ry) GetLog()<< " Ry";
        if (this->c_rz) GetLog()<< " Rz";
        GetLog()<< *this->C << "\n";
    */
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            if (do_clamp) {
                if (mask.Constr_N(i).IsUnilateral())
                    mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() +
                                              ChMax(factor * C(cnt), -recovery_clamp));
                else
                    mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() +
                                              ChMin(ChMax(factor * C(cnt), -recovery_clamp), recovery_clamp));
            } else
                mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() + factor * C(cnt));

            cnt++;
        }
    }
}